

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::mergeTracks(MidiFile *this,int aTrack1,int aTrack2)

{
  int iVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  MidiEventList *this_00;
  int iVar4;
  int iVar5;
  MidiEventList *this_01;
  MidiEvent *pMVar6;
  size_type sVar7;
  size_type __new_size;
  
  this_01 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(this_01);
  iVar1 = this->m_theTimeState;
  if (iVar1 == 0) {
    makeAbsoluteTicks(this);
  }
  ppMVar2 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar3 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar4 = MidiEventList::size(ppMVar2[aTrack1]);
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      pMVar6 = MidiEventList::operator[]
                         ((this->m_events).
                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[aTrack1],iVar4);
      MidiEventList::push_back(this_01,pMVar6);
      iVar4 = iVar4 + 1;
      iVar5 = MidiEventList::size((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[aTrack1]);
    } while (iVar4 < iVar5);
  }
  sVar7 = (size_type)aTrack2;
  iVar4 = MidiEventList::size((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar7]);
  if (0 < iVar4) {
    iVar4 = 0;
    do {
      pMVar6 = MidiEventList::operator[]
                         ((this->m_events).
                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar7],iVar4);
      pMVar6->track = aTrack1;
      pMVar6 = MidiEventList::operator[]
                         ((this->m_events).
                          super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar7],iVar4);
      MidiEventList::push_back(this_01,pMVar6);
      iVar4 = iVar4 + 1;
      iVar5 = MidiEventList::size((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[sVar7]);
    } while (iVar4 < iVar5);
  }
  MidiEventList::sortNoteOnsBeforeOffs(this_01);
  this_00 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start[aTrack1];
  if (this_00 != (MidiEventList *)0x0) {
    MidiEventList::~MidiEventList(this_00);
    operator_delete(this_00);
  }
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_start[aTrack1] = this_01;
  iVar4 = (int)((ulong)((long)ppMVar3 - (long)ppMVar2) >> 3) + -1;
  __new_size = (size_type)iVar4;
  if (aTrack2 < iVar4) {
    do {
      ppMVar2 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppMVar2[sVar7] = ppMVar2[sVar7 + 1];
      iVar4 = MidiEventList::size((this->m_events).
                                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[sVar7]);
      if (0 < iVar4) {
        iVar4 = 0;
        do {
          pMVar6 = MidiEventList::operator[]
                             ((this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[sVar7],iVar4);
          pMVar6->track = (int)sVar7;
          iVar4 = iVar4 + 1;
          iVar5 = MidiEventList::size((this->m_events).
                                      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[sVar7]);
        } while (iVar4 < iVar5);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != __new_size);
  }
  (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
  _M_impl.super__Vector_impl_data._M_start[__new_size] = (MidiEventList *)0x0;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,__new_size);
  if (iVar1 != 0) {
    return;
  }
  makeDeltaTicks(this);
  return;
}

Assistant:

void MidiFile::mergeTracks(int aTrack1, int aTrack2) {
	MidiEventList* mergedTrack;
	mergedTrack = new MidiEventList;
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}
	int length = getNumTracks();
	for (int i=0; i<(int)m_events[aTrack1]->size(); i++) {
		mergedTrack->push_back((*m_events[aTrack1])[i]);
	}
	for (int j=0; j<(int)m_events[aTrack2]->size(); j++) {
		(*m_events[aTrack2])[j].track = aTrack1;
		mergedTrack->push_back((*m_events[aTrack2])[j]);
	}

	mergedTrack->sort();

	delete m_events[aTrack1];

	m_events[aTrack1] = mergedTrack;

	for (int i=aTrack2; i<length-1; i++) {
		m_events[i] = m_events[i+1];
		for (int j=0; j<(int)m_events[i]->size(); j++) {
			(*m_events[i])[j].track = i;
		}
	}

	m_events[length-1] = NULL;
	m_events.resize(length-1);

	if (oldTimeState == TIME_STATE_DELTA) {
		deltaTicks();
	}
}